

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdlib.cpp
# Opt level: O0

int ParseHex(char *hex,FScriptPosition *sc)

{
  int iVar1;
  int local_2c;
  char *pcStack_28;
  int num;
  char *str;
  FScriptPosition *sc_local;
  char *hex_local;
  
  local_2c = 0;
  pcStack_28 = hex;
  do {
    if (*pcStack_28 == '\0') {
      return local_2c;
    }
    if ((*pcStack_28 < '0') || ('9' < *pcStack_28)) {
      if ((*pcStack_28 < 'a') || ('f' < *pcStack_28)) {
        if ((*pcStack_28 < 'A') || ('F' < *pcStack_28)) {
          if (sc == (FScriptPosition *)0x0) {
            Printf("Bad hex number: %s\n",hex);
          }
          else {
            FScriptPosition::Message(sc,0,"Bad hex number: %s",hex);
          }
          return 0;
        }
        iVar1 = *pcStack_28 + -0x37;
      }
      else {
        iVar1 = *pcStack_28 + -0x57;
      }
    }
    else {
      iVar1 = *pcStack_28 + -0x30;
    }
    local_2c = iVar1 + local_2c * 0x10;
    pcStack_28 = pcStack_28 + 1;
  } while( true );
}

Assistant:

int ParseHex (const char *hex, FScriptPosition *sc)
{
	const char *str;
	int num;

	num = 0;
	str = hex;

	while (*str)
	{
		num <<= 4;
		if (*str >= '0' && *str <= '9')
			num += *str-'0';
		else if (*str >= 'a' && *str <= 'f')
			num += 10 + *str-'a';
		else if (*str >= 'A' && *str <= 'F')
			num += 10 + *str-'A';
		else {
			if (!sc) Printf ("Bad hex number: %s\n",hex);
			else sc->Message(MSG_WARNING, "Bad hex number: %s", hex);
			return 0;
		}
		str++;
	}

	return num;
}